

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinflate.c
# Opt level: O1

int tinf_inflate_block_data(tinf_data *d,tinf_tree *lt,tinf_tree *dt)

{
  ushort uVar1;
  ushort uVar2;
  uchar *puVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int in_ECX;
  ulong uVar9;
  uint local_34;
  
  do {
    uVar6 = tinf_decode_symbol(d,lt);
    if (d->overflow != 0) goto LAB_00103e9b;
    if (uVar6 < 0x100) {
      puVar3 = d->dest;
      if (puVar3 == d->dest_end) {
LAB_00103fb8:
        bVar4 = false;
        iVar5 = -5;
      }
      else {
        d->dest = puVar3 + 1;
        *puVar3 = (uchar)uVar6;
LAB_00103ec8:
        bVar4 = true;
        iVar5 = in_ECX;
      }
    }
    else {
      bVar4 = false;
      iVar5 = 0;
      if (uVar6 != 0x100) {
        if ((((int)uVar6 <= lt->max_sym) && (uVar6 < 0x11e)) && (uVar7 = 0, dt->max_sym != -1)) {
          uVar6 = uVar6 - 0x101;
          uVar1 = tinf_inflate_block_data::length_base[uVar6];
          if ((0x100000ffUL >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
            uVar7 = tinf_getbits(d,(uint)""[uVar6]);
          }
          uVar6 = tinf_decode_symbol(d,dt);
          if ((uVar6 < 0x1e) && ((int)uVar6 <= dt->max_sym)) {
            uVar2 = tinf_inflate_block_data::dist_base[uVar6];
            uVar8 = 0;
            if (3 < uVar6) {
              uVar8 = tinf_getbits(d,(uint)""[uVar6]);
            }
            if ((long)(int)(uVar8 + uVar2) <= (long)d->dest - (long)d->dest_start) {
              local_34 = (uint)uVar1;
              uVar7 = uVar7 + local_34;
              if ((long)d->dest_end - (long)d->dest < (long)(int)uVar7) goto LAB_00103fb8;
              if (0 < (int)uVar7) {
                uVar9 = 0;
                do {
                  d->dest[uVar9] = d->dest[uVar9 - (long)(int)(uVar8 + uVar2)];
                  uVar9 = uVar9 + 1;
                } while (uVar7 != uVar9);
              }
              d->dest = d->dest + (int)uVar7;
              goto LAB_00103ec8;
            }
            bVar4 = false;
            iVar5 = -3;
            goto LAB_00103ea0;
          }
        }
LAB_00103e9b:
        bVar4 = false;
        iVar5 = -3;
      }
    }
LAB_00103ea0:
    in_ECX = iVar5;
    if (!bVar4) {
      return in_ECX;
    }
  } while( true );
}

Assistant:

static int tinf_inflate_block_data(struct tinf_data *d, struct tinf_tree *lt,
                                   struct tinf_tree *dt)
{
	/* Extra bits and base tables for length codes */
	static const unsigned char length_bits[30] = {
		0, 0, 0, 0, 0, 0, 0, 0, 1, 1,
		1, 1, 2, 2, 2, 2, 3, 3, 3, 3,
		4, 4, 4, 4, 5, 5, 5, 5, 0, 127
	};

	static const unsigned short length_base[30] = {
		 3,  4,  5,   6,   7,   8,   9,  10,  11,  13,
		15, 17, 19,  23,  27,  31,  35,  43,  51,  59,
		67, 83, 99, 115, 131, 163, 195, 227, 258,   0
	};

	/* Extra bits and base tables for distance codes */
	static const unsigned char dist_bits[30] = {
		0, 0,  0,  0,  1,  1,  2,  2,  3,  3,
		4, 4,  5,  5,  6,  6,  7,  7,  8,  8,
		9, 9, 10, 10, 11, 11, 12, 12, 13, 13
	};

	static const unsigned short dist_base[30] = {
		   1,    2,    3,    4,    5,    7,    9,    13,    17,    25,
		  33,   49,   65,   97,  129,  193,  257,   385,   513,   769,
		1025, 1537, 2049, 3073, 4097, 6145, 8193, 12289, 16385, 24577
	};

	for (;;) {
		int sym = tinf_decode_symbol(d, lt);

		/* Check for overflow in bit reader */
		if (d->overflow) {
			return TINF_DATA_ERROR;
		}

		if (sym < 256) {
			if (d->dest == d->dest_end) {
				return TINF_BUF_ERROR;
			}
			*d->dest++ = sym;
		}
		else {
			int length, dist, offs;
			int i;

			/* Check for end of block */
			if (sym == 256) {
				return TINF_OK;
			}

			/* Check sym is within range and distance tree is not empty */
			if (sym > lt->max_sym || sym - 257 > 28 || dt->max_sym == -1) {
				return TINF_DATA_ERROR;
			}

			sym -= 257;

			/* Possibly get more bits from length code */
			length = tinf_getbits_base(d, length_bits[sym],
			                           length_base[sym]);

			dist = tinf_decode_symbol(d, dt);

			/* Check dist is within range */
			if (dist > dt->max_sym || dist > 29) {
				return TINF_DATA_ERROR;
			}

			/* Possibly get more bits from distance code */
			offs = tinf_getbits_base(d, dist_bits[dist],
			                         dist_base[dist]);

			if (offs > d->dest - d->dest_start) {
				return TINF_DATA_ERROR;
			}

			if (d->dest_end - d->dest < length) {
				return TINF_BUF_ERROR;
			}

			/* Copy match */
			for (i = 0; i < length; ++i) {
				d->dest[i] = d->dest[i - offs];
			}

			d->dest += length;
		}
	}
}